

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::ArrayPtr<char_const>&,char_const(&)[18],char*>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params,
          char (*params_1) [18],char **params_2)

{
  ArrayPtr<const_char> *value;
  char (*value_00) [18];
  char **value_01;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  char (*local_28) [18];
  char **params_local_2;
  char (*params_local_1) [18];
  ArrayPtr<const_char> *params_local;
  
  local_28 = params_1;
  params_local_2 = &params->ptr;
  params_local_1 = (char (*) [18])this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  value = fwd<kj::ArrayPtr<char_const>&>((ArrayPtr<const_char> *)this);
  local_38 = toCharSequence<kj::ArrayPtr<char_const>&>(value);
  value_00 = ::const((char (*) [18])params_local_2);
  local_48 = toCharSequence<char_const(&)[18]>(value_00);
  value_01 = fwd<char*>((NoInfer<char_*> *)local_28);
  local_58 = toCharSequence<char*>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}